

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

shared_ptr<unsigned_short>
chaiscript::bootstrap::detail::construct_pod<unsigned_short>(Boxed_Number *v)

{
  element_type *in_RDI;
  shared_ptr<unsigned_short> sVar1;
  unsigned_short *in_stack_00000008;
  undefined6 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffee;
  
  Boxed_Number::get_as<unsigned_short>
            ((Boxed_Number *)CONCAT26(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8));
  sVar1 = std::make_shared<unsigned_short,unsigned_short>(in_stack_00000008);
  sVar1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<unsigned_short>)
         sVar1.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<P1> construct_pod(const Boxed_Number &v)
      {
        return std::make_shared<P1>(v.get_as<P1>());
      }